

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool duckdb::SubtractPropagateStatistics::Operation<short,duckdb::TryDecimalSubtract>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  Value local_70;
  
  sVar1 = NumericStats::GetMin<short>(lstats);
  sVar2 = NumericStats::GetMax<short>(rstats);
  if (sVar2 < 0) {
    if (sVar2 + 9999 < (int)sVar1) {
      return true;
    }
  }
  else if ((int)sVar1 < sVar2 + -9999) {
    return true;
  }
  sVar3 = NumericStats::GetMax<short>(lstats);
  sVar4 = NumericStats::GetMin<short>(rstats);
  if (sVar4 < 0) {
    if (sVar4 + 9999 < (int)sVar3) {
      return true;
    }
  }
  else if ((int)sVar3 < sVar4 + -9999) {
    return true;
  }
  Value::Numeric(&local_70,type,(long)(short)(sVar1 - sVar2));
  Value::operator=(new_min,&local_70);
  Value::~Value(&local_70);
  Value::Numeric(&local_70,type,(long)(short)(sVar3 - sVar4));
  Value::operator=(new_max,&local_70);
  Value::~Value(&local_70);
  return false;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(rstats), min)) {
			return true;
		}
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMin<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}